

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall
embree::XMLWriter::store
          (XMLWriter *this,Ref<embree::SceneGraph::PerspectiveCameraNode> *camera,ssize_t id)

{
  ostream *poVar1;
  
  tab(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x10,"<PerspectiveCamera ");
  poVar1 = std::operator<<(poVar1,"id=\"");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1,"\" ");
  poVar1 = std::operator<<(poVar1,"name=\"");
  poVar1 = std::operator<<(poVar1,(string *)&(camera->ptr->super_Node).name);
  poVar1 = std::operator<<(poVar1,"\" ");
  poVar1 = std::operator<<(poVar1,"from=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(camera->ptr->data).from.field_0.m128[0]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(camera->ptr->data).from.field_0.m128[1]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(camera->ptr->data).from.field_0.m128[2]);
  poVar1 = std::operator<<(poVar1,"\" ");
  poVar1 = std::operator<<(poVar1,"to=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(camera->ptr->data).to.field_0.m128[0]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(camera->ptr->data).to.field_0.m128[1]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(camera->ptr->data).to.field_0.m128[2]);
  poVar1 = std::operator<<(poVar1,"\" ");
  poVar1 = std::operator<<(poVar1,"up=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(camera->ptr->data).up.field_0.m128[0]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(camera->ptr->data).up.field_0.m128[1]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(camera->ptr->data).up.field_0.m128[2]);
  poVar1 = std::operator<<(poVar1,"\" ");
  poVar1 = std::operator<<(poVar1,"fov=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(camera->ptr->data).fov);
  poVar1 = std::operator<<(poVar1,"\" ");
  poVar1 = std::operator<<(poVar1,"/>");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::PerspectiveCameraNode> camera, ssize_t id)
  {
    tab(); 
    xml << "<PerspectiveCamera " <<
      "id=\"" << id << "\" " << 
      "name=\"" << camera->name << "\" " <<
      "from=\"" << camera->data.from.x << " " << camera->data.from.y << " " << camera->data.from.z << "\" " <<
      "to=\""   << camera->data.to.x   << " " << camera->data.to.y   << " " << camera->data.to.z << "\" " <<
      "up=\""   << camera->data.up.x   << " " << camera->data.up.y   << " " << camera->data.up.z << "\" " <<
      "fov=\""  << camera->data.fov << "\" " << "/>" << std::endl;
  }